

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O2

void __thiscall
MonahanPlanner::PlanWithCache(MonahanPlanner *this,string *filenameCache,bool computeIfNotCached)

{
  uint uVar1;
  ostream *poVar2;
  E *this_00;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ifstream fp;
  ostream local_220 [16];
  uint auStack_210 [122];
  
  if (this->_m_initialized == false) {
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[3])(this);
  }
  std::operator+(&local_250,filenameCache,"_t0");
  std::ifstream::ifstream(&fp,local_250._M_dataplus._M_p,_S_in);
  std::__cxx11::string::~string((string *)&local_250);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_fp + -0x18));
  std::ifstream::~ifstream(&fp);
  if ((uVar1 & 5) == 0 || computeIfNotCached) {
    if ((uVar1 & 5) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"MonahanPlanner: loading cached ");
      poVar2 = std::operator<<(poVar2,(string *)filenameCache);
      std::endl<char,std::char_traits<char>>(poVar2);
      Load(this,filenameCache);
    }
    else {
      (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[4])(this);
      Save(this,filenameCache);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fp);
  poVar2 = std::operator<<(local_220,"MonahanPlanner::PlanWithCache: ");
  poVar2 = std::operator<<(poVar2,(string *)filenameCache);
  std::operator<<(poVar2," not cached, bailing out");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&local_270);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void MonahanPlanner::PlanWithCache(const string &filenameCache,
                                   bool computeIfNotCached)
{
    if(!_m_initialized)
        Initialize();

    bool cached;

    {
        ifstream fp(string(filenameCache + "_t0").c_str());
        if(!fp)
            cached=false;
        else
            cached=true;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "MonahanPlanner::PlanWithCache: "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Plan();
        Save(filenameCache);
    }
    else 
    {
        cout << "MonahanPlanner: loading cached " << filenameCache
             << endl;
        Load(filenameCache);
    }
}